

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
* __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *__return_storage_ptr__,CompilerGLSL *this,SPIRType *basetype,uint32_t *indices,
          uint32_t count,uint32_t offset,uint32_t word_stride,bool *need_transpose,
          uint32_t *out_matrix_stride,uint32_t *out_array_stride,bool ptr_chain)

{
  ID id;
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRConstant *pSVar4;
  SPIRType *pSVar5;
  Bitset *pBVar6;
  CompilerError *pCVar7;
  ulong uVar8;
  allocator local_d2;
  char local_d1;
  SPIRType *local_d0;
  uint local_c4;
  uint32_t local_c0;
  uint local_bc;
  CompilerGLSL *local_b8;
  Bitset local_b0;
  string expr;
  
  local_bc = offset;
  local_d0 = Compiler::get_pointee_type(&this->super_Compiler,basetype);
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  local_c0 = 0;
  if (need_transpose == (bool *)0x0) {
    local_c4 = 0;
  }
  else {
    local_c4 = (uint)CONCAT71((int7)((ulong)local_d0 >> 8),*need_transpose);
  }
  if (out_matrix_stride != (uint32_t *)0x0) {
    local_c0 = *out_matrix_stride;
  }
  if (out_array_stride == (uint32_t *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *out_array_stride;
  }
  uVar8 = 0;
  local_d1 = !ptr_chain;
  local_b8 = this;
  do {
    if (count == uVar8) {
      if (need_transpose != (bool *)0x0) {
        *need_transpose = (bool)((byte)local_c4 & 1);
      }
      if (out_matrix_stride != (uint32_t *)0x0) {
        *out_matrix_stride = local_c0;
      }
      if (out_array_stride != (uint32_t *)0x0) {
        *out_array_stride = uVar1;
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&expr);
      __return_storage_ptr__->second = local_bc;
      ::std::__cxx11::string::~string((string *)&expr);
      return __return_storage_ptr__;
    }
    uVar2 = indices[uVar8];
    if (uVar8 == 0 && local_d1 == '\0') {
      uVar1 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(basetype->super_IVariant).self.id,
                         DecorationArrayStride);
      this = local_b8;
      if (uVar1 == 0) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_b0,"SPIR-V does not define ArrayStride for buffer block.",
                   &local_d2);
        CompilerError::CompilerError(pCVar7,(string *)&local_b0);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar4 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&local_b8->super_Compiler,uVar2);
      if (pSVar4 == (SPIRConstant *)0x0) {
        if (uVar1 % word_stride != 0) {
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_b0,
                     "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                     ,&local_d2);
          CompilerError::CompilerError(pCVar7,(string *)&local_b0);
          __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_enclosed_expression_abi_cxx11_((string *)&local_b0,this,uVar2,true);
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::append((char *)&expr);
        ::std::__cxx11::to_string((string *)&local_b0,uVar1 / word_stride);
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::append((char *)&expr);
        pSVar5 = local_d0;
      }
      else {
        local_bc = local_bc + (pSVar4->m).c[0].r[0].u32 * uVar1;
        pSVar5 = local_d0;
      }
    }
    else if ((local_d0->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      if (*(int *)&(local_d0->super_IVariant).field_0xc == 0xf) {
        uVar2 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar2);
        if ((local_d0->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size <= (ulong)uVar2) {
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_b0,"Member index is out of bounds!",&local_d2);
          CompilerError::CompilerError(pCVar7,(string *)&local_b0);
          __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar3 = Compiler::type_struct_member_offset(&local_b8->super_Compiler,local_d0,uVar2);
        pSVar5 = Compiler::get<spirv_cross::SPIRType>
                           (&local_b8->super_Compiler,
                            (local_d0->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar2].id);
        if (pSVar5->columns < 2) {
          local_c4 = 0;
        }
        else {
          local_c0 = Compiler::type_struct_member_matrix_stride
                               (&local_b8->super_Compiler,local_d0,uVar2);
          pBVar6 = Compiler::combined_decoration_for_member
                             (&local_b0,&local_b8->super_Compiler,local_d0,uVar2);
          local_c4 = (uint)CONCAT71((int7)((ulong)pBVar6 >> 8),(byte)local_b0.lower >> 4);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_b0.higher._M_h);
        }
        local_bc = local_bc + uVar3;
        this = local_b8;
        if ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          uVar1 = Compiler::type_struct_member_array_stride
                            (&local_b8->super_Compiler,local_d0,uVar2);
          this = local_b8;
        }
      }
      else if (local_d0->columns < 2) {
        if (local_d0->vecsize < 2) {
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_b0,"Cannot subdivide a scalar value!",&local_d2);
          CompilerError::CompilerError(pCVar7,(string *)&local_b0);
          __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pSVar4 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
        if (pSVar4 == (SPIRConstant *)0x0) {
          uVar3 = local_c0;
          if ((local_c4 & 1) == 0) {
            uVar3 = local_d0->width >> 3;
          }
          if (uVar3 % word_stride != 0) {
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_b0,
                       "Stride for dynamic vector indexing must be divisible by the size of a 4-component vector. This cannot be flattened in legacy targets."
                       ,&local_d2);
            CompilerError::CompilerError(pCVar7,(string *)&local_b0);
            __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          to_enclosed_expression_abi_cxx11_((string *)&local_b0,this,uVar2,false);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_b0);
          ::std::__cxx11::string::append((char *)&expr);
          ::std::__cxx11::to_string((string *)&local_b0,uVar3 / word_stride);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_b0);
          ::std::__cxx11::string::append((char *)&expr);
        }
        else {
          uVar3 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar2);
          uVar2 = local_c0;
          if ((local_c4 & 1) == 0) {
            uVar2 = local_d0->width >> 3;
          }
          local_bc = local_bc + uVar2 * uVar3;
        }
        pSVar5 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,(local_d0->parent_type).id);
      }
      else {
        pSVar4 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
        if (pSVar4 == (SPIRConstant *)0x0) {
          uVar3 = local_c0;
          if ((local_c4 & 1) != 0) {
            uVar3 = local_d0->width >> 3;
          }
          if (uVar3 % word_stride != 0) {
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_b0,
                       "Matrix stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a row-major matrix being accessed dynamically. This cannot be flattened. Try using std140 layout instead."
                       ,&local_d2);
            CompilerError::CompilerError(pCVar7,(string *)&local_b0);
            __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          to_enclosed_expression_abi_cxx11_((string *)&local_b0,this,uVar2,false);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_b0);
          ::std::__cxx11::string::append((char *)&expr);
          ::std::__cxx11::to_string((string *)&local_b0,uVar3 / word_stride);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_b0);
          ::std::__cxx11::string::append((char *)&expr);
        }
        else {
          uVar3 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar2);
          uVar2 = local_c0;
          if ((local_c4 & 1) != 0) {
            uVar2 = local_d0->width >> 3;
          }
          local_bc = local_bc + uVar2 * uVar3;
        }
        pSVar5 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,(local_d0->parent_type).id);
      }
    }
    else {
      pSVar4 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
      if (pSVar4 == (SPIRConstant *)0x0) {
        if (uVar1 % word_stride != 0) {
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_b0,
                     "Array stride for dynamic indexing must be divisible by the size of a 4-component vector. Likely culprit here is a float or vec2 array inside a push constant block which is std430. This cannot be flattened. Try using std140 layout instead."
                     ,&local_d2);
          CompilerError::CompilerError(pCVar7,(string *)&local_b0);
          __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_enclosed_expression_abi_cxx11_((string *)&local_b0,this,uVar2,false);
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::append((char *)&expr);
        ::std::__cxx11::to_string((string *)&local_b0,uVar1 / word_stride);
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::append((char *)&expr);
      }
      else {
        local_bc = local_bc + (pSVar4->m).c[0].r[0].u32 * uVar1;
      }
      id.id = (local_d0->parent_type).id;
      local_d0 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id.id);
      pSVar5 = local_d0;
      if ((local_d0->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        uVar1 = Compiler::get_decoration(&this->super_Compiler,id,DecorationArrayStride);
        pSVar5 = local_d0;
      }
    }
    local_d0 = pSVar5;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

std::pair<std::string, uint32_t> CompilerGLSL::flattened_access_chain_offset(
    const SPIRType &basetype, const uint32_t *indices, uint32_t count, uint32_t offset, uint32_t word_stride,
    bool *need_transpose, uint32_t *out_matrix_stride, uint32_t *out_array_stride, bool ptr_chain)
{
	// Start traversing type hierarchy at the proper non-pointer types.
	const auto *type = &get_pointee_type(basetype);

	std::string expr;

	// Inherit matrix information in case we are access chaining a vector which might have come from a row major layout.
	bool row_major_matrix_needs_conversion = need_transpose ? *need_transpose : false;
	uint32_t matrix_stride = out_matrix_stride ? *out_matrix_stride : 0;
	uint32_t array_stride = out_array_stride ? *out_array_stride : 0;

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		// Pointers
		if (ptr_chain && i == 0)
		{
			// Here, the pointer type will be decorated with an array stride.
			array_stride = get_decoration(basetype.self, DecorationArrayStride);
			if (!array_stride)
				SPIRV_CROSS_THROW("SPIR-V does not define ArrayStride for buffer block.");

			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}
		}
		// Arrays
		else if (!type->array.empty())
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				// Constant array access.
				offset += constant->scalar() * array_stride;
			}
			else
			{
				// Dynamic array access.
				if (array_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Array stride for dynamic indexing must be divisible by the size "
					                  "of a 4-component vector. "
					                  "Likely culprit here is a float or vec2 array inside a push "
					                  "constant block which is std430. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(array_stride / word_stride);
				expr += " + ";
			}

			uint32_t parent_type = type->parent_type;
			type = &get<SPIRType>(parent_type);

			if (!type->array.empty())
				array_stride = get_decoration(parent_type, DecorationArrayStride);
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			offset += type_struct_member_offset(*type, index);

			auto &struct_type = *type;
			type = &get<SPIRType>(type->member_types[index]);

			if (type->columns > 1)
			{
				matrix_stride = type_struct_member_matrix_stride(struct_type, index);
				row_major_matrix_needs_conversion =
				    combined_decoration_for_member(struct_type, index).get(DecorationRowMajor);
			}
			else
				row_major_matrix_needs_conversion = false;

			if (!type->array.empty())
				array_stride = type_struct_member_array_stride(struct_type, index);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride);
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? (type->width / 8) : matrix_stride;
				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Matrix stride for dynamic indexing must be divisible by the size of a "
					                  "4-component vector. "
					                  "Likely culprit here is a row-major matrix being accessed dynamically. "
					                  "This cannot be flattened. Try using std140 layout instead.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			auto *constant = maybe_get<SPIRConstant>(index);
			if (constant)
			{
				index = evaluate_constant_u32(index);
				offset += index * (row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8));
			}
			else
			{
				uint32_t indexing_stride = row_major_matrix_needs_conversion ? matrix_stride : (type->width / 8);

				// Dynamic array access.
				if (indexing_stride % word_stride)
				{
					SPIRV_CROSS_THROW("Stride for dynamic vector indexing must be divisible by the "
					                  "size of a 4-component vector. "
					                  "This cannot be flattened in legacy targets.");
				}

				expr += to_enclosed_expression(index, false);
				expr += " * ";
				expr += convert_to_string(indexing_stride / word_stride);
				expr += " + ";
			}

			type = &get<SPIRType>(type->parent_type);
		}
		else
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (need_transpose)
		*need_transpose = row_major_matrix_needs_conversion;
	if (out_matrix_stride)
		*out_matrix_stride = matrix_stride;
	if (out_array_stride)
		*out_array_stride = array_stride;

	return std::make_pair(expr, offset);
}